

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPReader.h
# Opt level: O0

void __thiscall BMPReader::~BMPReader(BMPReader *this)

{
  ostream *this_00;
  BMPReader *this_local;
  
  if (this->rgbData != (RGB *)0x0) {
    if (this->rgbData != (RGB *)0x0) {
      operator_delete__(this->rgbData);
    }
    this->rgbData = (RGB *)0x0;
    this_00 = std::operator<<((ostream *)&std::cout,"Delete BMPReader::rgbData");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

~BMPReader() {
		if (rgbData) {
			delete[] rgbData; 
			rgbData = nullptr;
			std::cout << "Delete BMPReader::rgbData" << std::endl;
		}
	}